

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O0

bool __thiscall STrdDisc::writeToFile(STrdDisc *this,FILE *ftrd)

{
  size_t sVar1;
  FILE *ftrd_local;
  STrdDisc *this_local;
  
  if ((Options::IsBigEndian & 1) != 0) {
    swapEndianness(this);
  }
  sVar1 = fwrite(this,0x100,1,(FILE *)ftrd);
  if (sVar1 == 1) {
    if ((Options::IsBigEndian & 1) != 0) {
      swapEndianness(this);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool STrdDisc::writeToFile(FILE *ftrd) {
	if (Options::IsBigEndian) swapEndianness();		// fix endianness in binary form before write
	if (1 != fwrite(this, sizeof(STrdDisc), 1, ftrd)) return false;
	if (Options::IsBigEndian) swapEndianness();		// revert endianness back to native host form
	return true;
}